

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm_vecsmall::SmallVectorTemplateCommon<char_*,_void>::grow_pod
          (SmallVectorTemplateCommon<char_*,_void> *this,size_t MinSizeInBytes,size_t TSize)

{
  SmallVectorBase::grow_pod(&this->super_SmallVectorBase,&this->FirstEl,MinSizeInBytes,TSize);
  return;
}

Assistant:

void grow_pod(size_t MinSizeInBytes, size_t TSize) {
    SmallVectorBase::grow_pod(&FirstEl, MinSizeInBytes, TSize);
  }